

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O0

el_action_t em_capitol_case(EditLine *el,wint_t c)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t *ep;
  wchar_t *cp;
  wint_t c_local;
  EditLine *el_local;
  
  pwVar3 = c__next_word((el->el_line).cursor,(el->el_line).lastchar,(el->el_state).argument,
                        ce__isword);
  ep = (el->el_line).cursor;
  do {
    if (pwVar3 <= ep) {
LAB_0012727f:
      for (; ep < pwVar3; ep = ep + 1) {
        iVar1 = iswupper(*ep);
        if (iVar1 != 0) {
          wVar2 = towlower(*ep);
          *ep = wVar2;
        }
      }
      (el->el_line).cursor = pwVar3;
      if ((el->el_line).lastchar < (el->el_line).cursor) {
        (el->el_line).cursor = (el->el_line).lastchar;
      }
      return '\x04';
    }
    iVar1 = iswalpha(*ep);
    if (iVar1 != 0) {
      iVar1 = iswlower(*ep);
      if (iVar1 != 0) {
        wVar2 = towupper(*ep);
        *ep = wVar2;
      }
      ep = ep + 1;
      goto LAB_0012727f;
    }
    ep = ep + 1;
  } while( true );
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_capitol_case(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *cp, *ep;

	ep = c__next_word(el->el_line.cursor, el->el_line.lastchar,
	    el->el_state.argument, ce__isword);

	for (cp = el->el_line.cursor; cp < ep; cp++) {
		if (iswalpha(*cp)) {
			if (iswlower(*cp))
				*cp = towupper(*cp);
			cp++;
			break;
		}
	}
	for (; cp < ep; cp++)
		if (iswupper(*cp))
			*cp = towlower(*cp);

	el->el_line.cursor = ep;
	if (el->el_line.cursor > el->el_line.lastchar)
		el->el_line.cursor = el->el_line.lastchar;
	return CC_REFRESH;
}